

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

uint32 __thiscall
Clasp::mt::SharedLitsClause::isOpen(SharedLitsClause *this,Solver *s,TypeSet *x,LitVec *freeLits)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint32 uVar4;
  ulong uVar5;
  SharedLiterals *pSVar6;
  
  uVar4 = 0;
  if (((x->m >> ((this->super_ClauseHead).info_.super_ConstraintScore.rep >> 0x1c & 3) & 1) != 0) &&
     (bVar2 = ClauseHead::satisfied(&this->super_ClauseHead,s), uVar4 = 0, !bVar2)) {
    pSVar6 = (this->super_ClauseHead).field_0.shared_;
    uVar1 = pSVar6->size_type_;
    if (3 < uVar1) {
      uVar5 = (ulong)(uVar1 & 0xfffffffc);
      pSVar6 = pSVar6 + 1;
      do {
        uVar1 = (pSVar6->refCount_).super___atomic_base<int>._M_i;
        bVar3 = *(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) & 3;
        if (bVar3 == 0) {
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (freeLits,(Literal *)pSVar6);
        }
        else if (bVar3 == (byte)(2U - ((uVar1 & 2) == 0))) {
          (this->super_ClauseHead).head_[2].rep_ = uVar1;
          return 0;
        }
        pSVar6 = (SharedLiterals *)&pSVar6->size_type_;
        uVar5 = uVar5 - 4;
      } while (uVar5 != 0);
    }
    uVar4 = (this->super_ClauseHead).info_.super_ConstraintScore.rep >> 0x1c & 3;
  }
  return uVar4;
}

Assistant:

uint32 SharedLitsClause::isOpen(const Solver& s, const TypeSet& x, LitVec& freeLits) {
	if (!x.inSet(ClauseHead::type()) || ClauseHead::satisfied(s)) {
		return 0;
	}
	Literal* head = head_;
	ValueRep v;
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		if ( (v = s.value(r->var())) == value_free ) {
			freeLits.push_back(*r);
		}
		else if (v == trueValue(*r)) {
			head[2] = *r; // remember as cache literal
			return 0;
		}
	}
	return ClauseHead::type();
}